

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::LatchVisitor::visit(LatchVisitor *this,Generator *generator)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  undefined1 local_60 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::CombinationalStmtBlock> stmt_;
  
  psVar1 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    if ((long)psVar1 - (long)psVar2 >> 4 == lVar3) {
      return;
    }
    Generator::get_stmt((Generator *)local_60,(uint32_t)generator);
    if (*(int *)((long)local_60 + 0x78) == 4) {
      Stmt::as<kratos::StmtBlock>
                ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xd].
          _M_use_count == 1) {
        Stmt::as<kratos::SequentialStmtBlock>
                  ((Stmt *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        check_sequential((SequentialStmtBlock *)
                         blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
LAB_001b6782:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_);
      }
      else if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               [0xd]._M_use_count == 0) {
        Stmt::as<kratos::CombinationalStmtBlock>
                  ((Stmt *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        check_combinational((CombinationalStmtBlock *)
                            blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
        goto LAB_001b6782;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blk);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto blk = stmt->as<StmtBlock>();
                if (blk->block_type() == StatementBlockType::Combinational) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<CombinationalStmtBlock>();
                    check_combinational(stmt_.get());
                } else if (blk->block_type() == StatementBlockType::Sequential) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<SequentialStmtBlock>();
                    check_sequential(stmt_.get());
                }
            }
        }
    }